

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  uint uVar1;
  GLFWbool GVar2;
  int local_28;
  int local_24;
  int i_1;
  int i;
  _GLFWwindow *window;
  int value_local;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/glfw/src/input.c"
                  ,0x1f5,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (mode == 0x33001) {
    if (((value == 0x34001) || (value == 0x34002)) || (value == 0x34003)) {
      if (*(int *)(handle + 0x74) != value) {
        *(int *)(handle + 0x74) = value;
        _glfwPlatformGetCursorPos
                  ((_GLFWwindow *)handle,(double *)(handle + 0x1e0),(double *)(handle + 0x1e8));
        _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
      }
    }
    else {
      _glfwInputError(0x10003,"Invalid cursor mode 0x%08X",(ulong)(uint)value);
    }
  }
  else if (mode == 0x33002) {
    uVar1 = (uint)(value != 0);
    if (*(uint *)(handle + 0x68) != uVar1) {
      if (uVar1 == 0) {
        for (local_24 = 0; local_24 < 0x15d; local_24 = local_24 + 1) {
          if (handle[(long)local_24 + 0x80] == (GLFWwindow)0x3) {
            handle[(long)local_24 + 0x80] = (GLFWwindow)0x0;
          }
        }
      }
      *(uint *)(handle + 0x68) = uVar1;
    }
  }
  else if (mode == 0x33003) {
    uVar1 = (uint)(value != 0);
    if (*(uint *)(handle + 0x6c) != uVar1) {
      if (uVar1 == 0) {
        for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
          if (handle[(long)local_28 + 0x78] == (GLFWwindow)0x3) {
            handle[(long)local_28 + 0x78] = (GLFWwindow)0x0;
          }
        }
      }
      *(uint *)(handle + 0x6c) = uVar1;
    }
  }
  else if (mode == 0x33004) {
    *(uint *)(handle + 0x70) = (uint)(value != 0);
  }
  else if (mode == 0x33005) {
    GVar2 = _glfwPlatformRawMouseMotionSupported();
    if (GVar2 == 0) {
      _glfwInputError(0x10008,"Raw mouse motion is not supported on this system");
    }
    else {
      uVar1 = (uint)(value != 0);
      if (*(uint *)(handle + 0x1f0) != uVar1) {
        *(uint *)(handle + 0x1f0) = uVar1;
        _glfwPlatformSetRawMouseMotion((_GLFWwindow *)handle,uVar1);
      }
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)(uint)mode);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (mode == GLFW_CURSOR)
    {
        if (value != GLFW_CURSOR_NORMAL &&
            value != GLFW_CURSOR_HIDDEN &&
            value != GLFW_CURSOR_DISABLED)
        {
            _glfwInputError(GLFW_INVALID_ENUM,
                            "Invalid cursor mode 0x%08X",
                            value);
            return;
        }

        if (window->cursorMode == value)
            return;

        window->cursorMode = value;

        _glfwPlatformGetCursorPos(window,
                                  &window->virtualCursorPosX,
                                  &window->virtualCursorPosY);
        _glfwPlatformSetCursorMode(window, value);
    }
    else if (mode == GLFW_STICKY_KEYS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyKeys == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky keys
            for (i = 0;  i <= GLFW_KEY_LAST;  i++)
            {
                if (window->keys[i] == _GLFW_STICK)
                    window->keys[i] = GLFW_RELEASE;
            }
        }

        window->stickyKeys = value;
    }
    else if (mode == GLFW_STICKY_MOUSE_BUTTONS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyMouseButtons == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky mouse buttons
            for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
            {
                if (window->mouseButtons[i] == _GLFW_STICK)
                    window->mouseButtons[i] = GLFW_RELEASE;
            }
        }

        window->stickyMouseButtons = value;
    }
    else if (mode == GLFW_LOCK_KEY_MODS)
    {
        window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
    }
    else if (mode == GLFW_RAW_MOUSE_MOTION)
    {
        if (!_glfwPlatformRawMouseMotionSupported())
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Raw mouse motion is not supported on this system");
            return;
        }

        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->rawMouseMotion == value)
            return;

        window->rawMouseMotion = value;
        _glfwPlatformSetRawMouseMotion(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}